

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::DiffuseAreaLight::L
          (DiffuseAreaLight *this,Point3f *p,Normal3f *n,Point2f *uv,Vector3f *w,
          SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  RGB *pRVar4;
  int c;
  int c_00;
  Float FVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined8 uVar11;
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [56];
  undefined1 auVar13 [64];
  SampledSpectrum SVar15;
  RGB local_98;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  DiffuseAreaLight *local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  RGBSpectrum local_58;
  undefined1 auVar8 [64];
  undefined1 auVar12 [64];
  
  if (this->twoSided == false) {
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
    fVar2 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar7 = ZEXT416((uint)(fVar1 * fVar2));
    auVar3 = vfmadd132ss_fma(ZEXT416((uint)(n->super_Tuple3<pbrt::Normal3,_float>).y),auVar7,
                             ZEXT416((uint)(w->super_Tuple3<pbrt::Vector3,_float>).y));
    auVar7 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar7);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar7._0_4_)),
                             ZEXT416((uint)(n->super_Tuple3<pbrt::Normal3,_float>).x),
                             ZEXT416((uint)(w->super_Tuple3<pbrt::Vector3,_float>).x));
    uVar11 = 0;
    in_ZMM1 = ZEXT864(0) << 0x20;
    uVar6 = 0;
    if (auVar3._0_4_ < 0.0) goto LAB_003753d6;
  }
  auVar14 = in_ZMM1._8_56_;
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    FVar5 = this->scale;
    local_88._4_4_ = FVar5;
    local_88._0_4_ = FVar5;
    uStack_80._0_4_ = FVar5;
    uStack_80._4_4_ = FVar5;
    auVar10 = ZEXT856(local_88._8_8_);
    SVar15 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
    auVar13._0_8_ = SVar15.values.values._8_8_;
    auVar13._8_56_ = auVar14;
    auVar9._0_8_ = SVar15.values.values._0_8_;
    auVar9._8_56_ = auVar10;
    auVar3 = vmovlhps_avx(auVar9._0_16_,auVar13._0_16_);
    auVar7._0_4_ = auVar3._0_4_ * (float)local_88._0_4_;
    auVar7._4_4_ = auVar3._4_4_ * (float)local_88._4_4_;
    auVar7._8_4_ = auVar3._8_4_ * (float)uStack_80;
    auVar7._12_4_ = auVar3._12_4_ * uStack_80._4_4_;
  }
  else {
    uStack_80 = local_88;
    local_88 = (undefined1  [8])lambda;
    local_98.r = 0.0;
    local_98.g = 0.0;
    local_98.b = 0.0;
    c_00 = 0;
    local_70 = this;
    do {
      FVar5 = Image::BilerpChannel
                        (&this->image,(Point2f)uv->super_Tuple2<pbrt::Point2,_float>,c_00,
                         (WrapMode2D)0x200000002);
      auVar14 = in_ZMM1._8_56_;
      pRVar4 = &local_98;
      if ((c_00 != 0) && (pRVar4 = (RGB *)&local_98.g, c_00 != 1)) {
        pRVar4 = (RGB *)&local_98.b;
      }
      pRVar4->r = FVar5;
      c_00 = c_00 + 1;
    } while (c_00 != 3);
    FVar5 = local_70->scale;
    local_68._4_4_ = FVar5;
    local_68._0_4_ = FVar5;
    fStack_60 = FVar5;
    fStack_5c = FVar5;
    auVar10 = ZEXT856(local_68._8_8_);
    RGBSpectrum::RGBSpectrum(&local_58,local_70->imageColorSpace,&local_98);
    SVar15 = RGBSpectrum::Sample(&local_58,(SampledWavelengths *)local_88);
    auVar12._0_8_ = SVar15.values.values._8_8_;
    auVar12._8_56_ = auVar14;
    auVar8._0_8_ = SVar15.values.values._0_8_;
    auVar8._8_56_ = auVar10;
    auVar3 = vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
    auVar7._0_4_ = auVar3._0_4_ * (float)local_68._0_4_;
    auVar7._4_4_ = auVar3._4_4_ * (float)local_68._4_4_;
    auVar7._8_4_ = auVar3._8_4_ * fStack_60;
    auVar7._12_4_ = auVar3._12_4_ * fStack_5c;
  }
  uVar6 = auVar7._0_8_;
  auVar3 = vshufpd_avx(auVar7,auVar7,1);
  uVar11 = auVar3._0_8_;
LAB_003753d6:
  SVar15.values.values[2] = (float)(int)uVar11;
  SVar15.values.values[3] = (float)(int)((ulong)uVar11 >> 0x20);
  SVar15.values.values[0] = (float)(int)uVar6;
  SVar15.values.values[1] = (float)(int)((ulong)uVar6 >> 0x20);
  return (SampledSpectrum)SVar15.values.values;
}

Assistant:

L(const Point3f &p, const Normal3f &n, const Point2f &uv,
                      const Vector3f &w, const SampledWavelengths &lambda) const {
        if (!twoSided && Dot(n, w) < 0)
            return SampledSpectrum(0.f);

        if (image) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.BilerpChannel(uv, c);
            return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
        } else
            return scale * Lemit.Sample(lambda);
    }